

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

void __thiscall llvm::APInt::initFromArray(APInt *this,ArrayRef<unsigned_long> bigVal)

{
  uint uVar1;
  unsigned_long *puVar2;
  uint64_t *__dest;
  uint uVar3;
  char *__assertion;
  ArrayRef<unsigned_long> bigVal_local;
  
  bigVal_local.Length = bigVal.Length;
  puVar2 = bigVal.Data;
  uVar1 = this->BitWidth;
  bigVal_local.Data = puVar2;
  if ((ulong)uVar1 == 0) {
    __assertion = "BitWidth && \"Bitwidth too small\"";
    uVar1 = 0x5b;
  }
  else {
    if (puVar2 != (unsigned_long *)0x0) {
      if (uVar1 < 0x41) {
        puVar2 = ArrayRef<unsigned_long>::operator[](&bigVal_local,0);
        (this->U).VAL = *puVar2;
      }
      else {
        __dest = getClearedMemory((uint)((ulong)uVar1 + 0x3f >> 6));
        (this->U).pVal = __dest;
        uVar3 = (uint)((ulong)this->BitWidth + 0x3f >> 6);
        uVar1 = (uint)bigVal.Length;
        if (uVar3 < (uint)bigVal.Length) {
          uVar1 = uVar3;
        }
        memcpy(__dest,puVar2,(ulong)(uVar1 << 3));
      }
      clearUnusedBits(this);
      return;
    }
    __assertion = "bigVal.data() && \"Null pointer detected!\"";
    uVar1 = 0x5c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,uVar1,"void llvm::APInt::initFromArray(ArrayRef<uint64_t>)");
}

Assistant:

void APInt::initFromArray(ArrayRef<uint64_t> bigVal) {
  assert(BitWidth && "Bitwidth too small");
  assert(bigVal.data() && "Null pointer detected!");
  if (isSingleWord())
    U.VAL = bigVal[0];
  else {
    // Get memory, cleared to 0
    U.pVal = getClearedMemory(getNumWords());
    // Calculate the number of words to copy
    unsigned words = std::min<unsigned>(bigVal.size(), getNumWords());
    // Copy the words from bigVal to pVal
    memcpy(U.pVal, bigVal.data(), words * APINT_WORD_SIZE);
  }
  // Make sure unused high bits are cleared
  clearUnusedBits();
}